

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Matrix3 * __thiscall stateObservation::kine::Orientation::toMatrix3(Orientation *this)

{
  check_(this);
  if ((this->m_).isSet_.b_ == false) {
    quaternionToMatrix_(this);
  }
  CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
            (&this->m_);
  return &(this->m_).v_;
}

Assistant:

inline const Matrix3 & Orientation::toMatrix3() const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_;
}